

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  char cVar4;
  bool bVar5;
  ImGuiID id;
  byte *pbVar6;
  bool bVar7;
  byte bVar8;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  char cVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ImGuiTableColumn *pIVar19;
  ulong uVar20;
  ImGuiTableColumn *pIVar21;
  bool bVar22;
  bool bVar23;
  uint uVar24;
  uint uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  ImRect host_clip_rect;
  ImRect local_58;
  ImGuiContext *local_48;
  ImRect local_40;
  
  local_48 = GImGui;
  if (table->IsLayoutLocked != false) {
    __assert_fail("table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0x2a2,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  uVar25 = table->Flags;
  uVar18 = table->ColumnsCount;
  table->IsDefaultDisplayOrder = true;
  table->ColumnsEnabledCount = '\0';
  table->EnabledMaskByDisplayOrder = 0;
  table->EnabledMaskByIndex = 0;
  fVar28 = (local_48->Style).FramePadding.x;
  fVar29 = 1.0;
  if (1.0 <= fVar28) {
    fVar29 = fVar28;
  }
  table->MinColumnWidth = fVar29;
  uVar12 = uVar25;
  if ((int)uVar18 < 1) {
    uVar24 = 0xffffffff;
    bVar7 = true;
    fVar28 = 0.0;
    fVar29 = 0.0;
    bVar22 = false;
    fVar26 = 0.0;
    cVar4 = '\0';
  }
  else {
    iVar11 = 0;
    uVar24 = 0xffffffff;
    uVar17 = 0;
    cVar4 = '\0';
    bVar22 = false;
    bVar7 = false;
    fVar29 = 0.0;
    fVar28 = 0.0;
    do {
      pbVar6 = (byte *)((table->DisplayOrderToIndex).Data + uVar17);
      if ((table->DisplayOrderToIndex).DataEnd <= pbVar6) goto LAB_0018da31;
      bVar8 = *pbVar6;
      uVar18 = (uint)(char)bVar8;
      if (uVar17 != uVar18) {
        table->IsDefaultDisplayOrder = false;
      }
      if (((char)bVar8 < '\0') ||
         (pIVar21 = (table->Columns).Data + (char)bVar8, (table->Columns).DataEnd <= pIVar21))
      goto LAB_0018da1a;
      if (table->DeclColumnsCount <= (char)bVar8) {
        TableSetupColumnFlags(table,pIVar21,0);
        pIVar21->NameOffset = -1;
        pIVar21->UserID = 0;
        pIVar21->InitStretchWeightOrWidth = -1.0;
        uVar12 = table->Flags;
      }
      if (((uVar12 & 4) == 0) || ((pIVar21->Flags & 0x80) != 0)) {
        pIVar21->IsEnabledNextFrame = true;
        bVar5 = true;
      }
      else {
        bVar5 = pIVar21->IsEnabledNextFrame;
      }
      if (pIVar21->IsEnabled == bVar5) {
        cVar14 = pIVar21->SortOrder;
      }
      else {
        pIVar21->IsEnabled = bVar5;
        table->IsSettingsDirty = true;
        cVar14 = pIVar21->SortOrder;
        if (cVar14 != -1 && (bVar5 & 1U) == 0) {
          table->IsSortSpecsDirty = true;
        }
      }
      if (((uVar12 >> 0x19 & 1) == 0) && ('\0' < cVar14)) {
        table->IsSortSpecsDirty = true;
      }
      uVar1 = pIVar21->Flags;
      if ((&pIVar21->WidthRequest)[(ulong)((uVar1 & 8) == 0) * 2] <= 0.0 &&
          (&pIVar21->WidthRequest)[(ulong)((uVar1 & 8) == 0) * 2] != 0.0) {
        pIVar21->AutoFitQueue = '\a';
        pIVar21->CannotSkipItemsQueue = '\a';
      }
      if ((bVar5 & 1U) == 0) {
        pIVar21->IndexWithinEnabledSet = -1;
      }
      else {
        pIVar21->PrevEnabledColumn = (ImGuiTableColumnIdx)uVar24;
        pIVar21->NextEnabledColumn = -1;
        if (uVar24 != 0xffffffff) {
          if (((int)uVar24 < 0) ||
             (pIVar19 = (table->Columns).Data + (int)uVar24, (table->Columns).DataEnd <= pIVar19))
          goto LAB_0018da1a;
          pIVar19->NextEnabledColumn = bVar8;
        }
        cVar14 = table->ColumnsEnabledCount;
        table->ColumnsEnabledCount = cVar14 + '\x01';
        pIVar21->IndexWithinEnabledSet = cVar14;
        table->EnabledMaskByIndex = table->EnabledMaskByIndex | 1L << (bVar8 & 0x3f);
        bVar8 = pIVar21->DisplayOrder;
        table->EnabledMaskByDisplayOrder = table->EnabledMaskByDisplayOrder | 1L << (bVar8 & 0x3f);
        if ((char)bVar8 < cVar14) {
          __assert_fail("column->IndexWithinEnabledSet <= column->DisplayOrder",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                        ,0x2e7,"void ImGui::TableUpdateLayout(ImGuiTable *)");
        }
        if (pIVar21->IsPreserveWidthAuto == false) {
          fVar26 = TableGetColumnWidthAuto(table,pIVar21);
          pIVar21->WidthAuto = fVar26;
        }
        if ((uVar1 & 0x20) == 0) {
          bVar7 = true;
        }
        if ((((uVar1 & 8) != 0) && ((uVar1 & 0x20) != 0)) &&
           (0.0 < pIVar21->InitStretchWeightOrWidth)) {
          pIVar21->WidthAuto = pIVar21->InitStretchWeightOrWidth;
        }
        bVar22 = (bool)(bVar22 | pIVar21->AutoFitQueue != '\0');
        fVar26 = pIVar21->WidthAuto;
        uVar24 = uVar18;
        if ((uVar1 & 4) == 0) {
          fVar28 = (float)((uint)fVar28 & -(uint)(fVar26 <= fVar28) |
                          ~-(uint)(fVar26 <= fVar28) & (uint)fVar26);
          cVar4 = cVar4 + '\x01';
        }
        else {
          fVar29 = fVar29 + fVar26;
          iVar11 = iVar11 + 1;
        }
      }
      uVar17 = uVar17 + 1;
      uVar18 = table->ColumnsCount;
    } while ((long)uVar17 < (long)(int)uVar18);
    fVar26 = (float)iVar11;
    bVar7 = !bVar7;
  }
  if ((((uVar12 & 8) != 0) && ((uVar12 >> 0x1a & 1) == 0)) && (table->SortSpecsCount == '\0')) {
    table->IsSortSpecsDirty = true;
  }
  table->RightMostEnabledColumn = (char)uVar24;
  if ((char)uVar24 < '\0') {
    __assert_fail("table->RightMostEnabledColumn >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0x305,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  if (bVar22) {
    if (table->OuterWindow != table->InnerWindow) {
      table->InnerWindow->SkipItems = false;
    }
    table->IsSettingsDirty = true;
  }
  table->LeftMostStretchedColumn = -1;
  table->RightMostStretchedColumn = -1;
  uVar17 = (ulong)uVar18;
  if ((int)uVar18 < 1) {
    fVar27 = 0.0;
    bVar22 = true;
    fVar30 = 0.0;
  }
  else {
    uVar20 = table->EnabledMaskByIndex;
    uVar15 = 0xff;
    lVar13 = 0x62;
    uVar9 = 0;
    uVar16 = 0xff;
    fVar30 = 0.0;
    fVar27 = 0.0;
    do {
      bVar8 = (byte)uVar9;
      if ((uVar20 >> (uVar9 & 0x3f) & 1) != 0) {
        pIVar21 = (table->Columns).Data;
        pIVar19 = (ImGuiTableColumn *)((long)pIVar21 + lVar13 + -0x62);
        if ((table->Columns).DataEnd <= pIVar19) goto LAB_0018da1a;
        uVar24 = pIVar19->Flags;
        if ((uVar24 & 8) == 0) {
          if ((((uVar24 & 0x20) != 0) || (*(char *)((long)&pIVar21->Flags + lVar13) != '\0')) ||
             (fVar31 = *(float *)((long)pIVar21 + lVar13 + -0x4a), fVar31 < 0.0)) {
            fVar31 = *(float *)((long)pIVar21 + lVar13 + -0x46);
            bVar22 = fVar31 <= 0.0;
            if (fVar31 <= 0.0) {
              fVar31 = 1.0;
            }
            if (bVar22 && (uVar25 & 0xe000) == 0x6000) {
              fVar31 = (*(float *)((long)pIVar21 + lVar13 + -0x4e) / fVar29) * fVar26;
            }
            *(float *)((long)pIVar21 + lVar13 + -0x4a) = fVar31;
          }
          cVar14 = (char)uVar16;
          if (cVar14 == -1) {
LAB_0018d081:
            table->LeftMostStretchedColumn = bVar8;
            uVar16 = uVar9 & 0xffffffff;
          }
          else {
            if ((cVar14 < '\0') || ((table->Columns).DataEnd <= pIVar21 + cVar14))
            goto LAB_0018da1a;
            if (*(char *)((long)pIVar21 + lVar13 + -0x10) < pIVar21[cVar14].DisplayOrder)
            goto LAB_0018d081;
          }
          fVar27 = fVar27 + fVar31;
          cVar14 = (char)uVar15;
          if (cVar14 != -1) {
            if ((cVar14 < '\0') || ((table->Columns).DataEnd <= pIVar21 + cVar14))
            goto LAB_0018da1a;
            if (*(char *)((long)pIVar21 + lVar13 + -0x10) <= pIVar21[cVar14].DisplayOrder)
            goto LAB_0018d162;
          }
          table->RightMostStretchedColumn = bVar8;
          uVar15 = uVar9 & 0xffffffff;
        }
        else {
          cVar14 = *(char *)((long)&pIVar21->Flags + lVar13);
          if ((uVar25 & 0xe000) == 0x4000) {
            fVar31 = fVar28;
            if ((uVar24 & 0x20) != 0 || cVar14 != '\0') goto LAB_0018d0ff;
          }
          else {
            fVar31 = *(float *)((long)pIVar21 + lVar13 + -0x4e);
LAB_0018d0ff:
            if (cVar14 == '\0') {
              if (((uVar24 & 0x20) != 0) &&
                 ((table->RequestOutputMaskByIndex & 1L << (bVar8 & 0x3f)) != 0)) {
                *(float *)((long)pIVar21 + lVar13 + -0x52) = fVar31;
              }
            }
            else {
              *(float *)((long)pIVar21 + lVar13 + -0x52) = fVar31;
              if (((cVar14 != '\x01') && (table->IsInitializing == true)) &&
                 (*(char *)((long)pIVar21 + lVar13 + -2) == '\0')) {
                fVar32 = table->MinColumnWidth * 4.0;
                uVar24 = -(uint)(fVar32 <= fVar31);
                *(uint *)((long)pIVar21 + lVar13 + -0x52) =
                     ~uVar24 & (uint)fVar32 | (uint)fVar31 & uVar24;
              }
            }
          }
          fVar30 = fVar30 + *(float *)((long)pIVar21 + lVar13 + -0x52);
        }
LAB_0018d162:
        *(undefined1 *)((long)pIVar21 + lVar13 + -2) = 0;
        fVar30 = fVar30 + table->CellPaddingX + table->CellPaddingX;
      }
      uVar9 = uVar9 + 1;
      lVar13 = lVar13 + 0x68;
    } while (uVar17 != uVar9);
    bVar22 = (char)uVar16 == -1;
  }
  table->ColumnsEnabledFixedCount = cVar4;
  fVar28 = (table->WorkRect).Min.x;
  fVar29 = table->OuterPaddingX + table->OuterPaddingX +
           (float)(table->ColumnsEnabledCount + -1) * (table->CellSpacingX1 + table->CellSpacingX2);
  if ((((uVar12 >> 0x17 & 1) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth))) {
    fVar26 = (table->WorkRect).Max.x - fVar28;
  }
  else {
    fVar26 = (table->InnerClipRect).Max.x - (table->InnerClipRect).Min.x;
  }
  fVar31 = (table->WorkRect).Min.y;
  fVar30 = (fVar26 - fVar29) - fVar30;
  fVar29 = (float)(int)table->ColumnsEnabledCount * (table->CellPaddingX + table->CellPaddingX) +
           fVar29;
  table->ColumnsGivenWidth = fVar29;
  fVar26 = fVar30;
  if (0 < (int)uVar18) {
    uVar20 = table->EnabledMaskByIndex;
    lVar13 = 0x55;
    uVar9 = 0;
    do {
      if ((uVar20 >> (uVar9 & 0x3f) & 1) != 0) {
        pIVar21 = (table->Columns).Data;
        pIVar19 = (ImGuiTableColumn *)((long)pIVar21 + lVar13 + -0x55);
        if ((table->Columns).DataEnd <= pIVar19) goto LAB_0018da1a;
        uVar25 = pIVar19->Flags;
        if ((uVar25 & 4) != 0) {
          fVar32 = (*(float *)((long)pIVar21 + lVar13 + -0x3d) / fVar27) * fVar30;
          uVar24 = -(uint)(table->MinColumnWidth <= fVar32);
          fVar32 = (float)(int)((float)(~uVar24 & (uint)table->MinColumnWidth |
                                       (uint)fVar32 & uVar24) + 0.01);
          *(float *)((long)pIVar21 + lVar13 + -0x45) = fVar32;
          fVar26 = fVar26 - fVar32;
        }
        if (*(char *)((long)&pIVar21->Flags + lVar13) == -1 && !bVar22) {
          pIVar19->Flags = uVar25 | 0x40000000;
        }
        fVar32 = *(float *)((long)pIVar21 + lVar13 + -0x45);
        uVar25 = -(uint)(table->MinColumnWidth <= fVar32);
        fVar32 = (float)(int)(float)(~uVar25 & (uint)table->MinColumnWidth | (uint)fVar32 & uVar25);
        *(float *)((long)pIVar21 + lVar13 + -0x51) = fVar32;
        fVar29 = fVar29 + fVar32;
        table->ColumnsGivenWidth = fVar29;
      }
      uVar9 = uVar9 + 1;
      lVar13 = lVar13 + 0x68;
    } while (uVar17 != uVar9);
  }
  if ((((uVar12 >> 0x12 & 1) == 0) && (1.0 <= fVar26)) && ((0 < (int)uVar18 && (0.0 < fVar27)))) {
    uVar20 = table->EnabledMaskByDisplayOrder;
    do {
      uVar9 = uVar17 - 1;
      if ((uVar20 >> (uVar9 & 0x3f) & 1) != 0) {
        pcVar10 = (table->DisplayOrderToIndex).Data + uVar9;
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar10) goto LAB_0018da31;
        lVar13 = (long)*pcVar10;
        if ((lVar13 < 0) ||
           (pIVar21 = (table->Columns).Data + lVar13, (table->Columns).DataEnd <= pIVar21))
        goto LAB_0018da1a;
        if ((pIVar21->Flags & 4) != 0) {
          pIVar21->WidthRequest = pIVar21->WidthRequest + 1.0;
          pIVar21->WidthGiven = pIVar21->WidthGiven + 1.0;
          fVar26 = fVar26 + -1.0;
        }
      }
    } while ((1.0 <= fVar26) && (bVar22 = 1 < uVar17, uVar17 = uVar9, bVar22));
  }
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  local_40.Max.x = (table->OuterRect).Max.x;
  fVar29 = (table->OuterRect).Max.y;
  local_40.Min = (table->OuterRect).Min;
  fVar26 = local_40.Min.y + table->LastOuterHeight;
  uVar25 = -(uint)(fVar26 <= fVar29);
  local_40.Max.y = (float)(uVar25 & (uint)fVar29 | ~uVar25 & (uint)fVar26);
  bVar5 = ItemHoverable(&local_40,0);
  bVar22 = '\0' < table->FreezeColumnsCount;
  fVar29 = fVar28;
  if ('\0' < table->FreezeColumnsCount) {
    fVar29 = (table->OuterRect).Min.x;
  }
  local_58.Min = (table->InnerClipRect).Min;
  local_58.Max = (table->InnerClipRect).Max;
  table->VisibleMaskByIndex = 0;
  table->RequestOutputMaskByIndex = 0;
  uVar17 = (ulong)(uint)table->ColumnsCount;
  if (table->ColumnsCount < 1) {
LAB_0018d83a:
    if ((-1 < (long)table->RightMostEnabledColumn) &&
       (pIVar21 = (table->Columns).Data + table->RightMostEnabledColumn,
       pIVar21 < (table->Columns).DataEnd)) {
      fVar28 = (table->WorkRect).Min.x;
      fVar29 = (pIVar21->ClipRect).Max.x;
      uVar25 = -(uint)(fVar29 <= fVar28);
      fVar28 = (float)(~uVar25 & (uint)fVar29 | (uint)fVar28 & uVar25);
      if ((bVar5) && ((table->HoveredColumnBody == -1 && (fVar28 <= (local_48->IO).MousePos.x)))) {
        table->HoveredColumnBody = (ImGuiTableColumnIdx)uVar17;
      }
      if ((bVar7) && ((table->Flags & 1U) != 0)) {
        table->Flags = table->Flags & 0xfffffffe;
      }
      if (table->RightMostStretchedColumn == -1) {
        if ((table->IsOuterRectMinFitX & 1U) != 0) {
          (table->WorkRect).Max.x = fVar28;
          (table->OuterRect).Max.x = fVar28;
          fVar29 = (table->InnerClipRect).Max.x;
          if (fVar28 <= fVar29) {
            fVar29 = fVar28;
          }
          (table->InnerClipRect).Max.x = fVar29;
        }
      }
      else {
        table->IsOuterRectMinFitX = false;
      }
      pIVar2 = table->InnerWindow;
      IVar3 = (table->WorkRect).Max;
      (pIVar2->ParentWorkRect).Min = (table->WorkRect).Min;
      (pIVar2->ParentWorkRect).Max = IVar3;
      fVar28 = (table->InnerClipRect).Max.x;
      table->BorderX1 = (table->InnerClipRect).Min.x;
      table->BorderX2 = fVar28;
      TableSetupDrawChannels(table);
      if ((table->Flags & 1) != 0) {
        TableUpdateBorders(table);
      }
      table->LastFirstRowHeight = 0.0;
      table->IsLayoutLocked = true;
      table->IsUsingHeaders = false;
      if ((table->IsContextPopupOpen == true) &&
         (table->InstanceCurrent == table->InstanceInteracted)) {
        id = ImHashStr("##ContextMenu",0,table->ID);
        bVar22 = BeginPopupEx(id,0x141);
        if (bVar22) {
          TableDrawContextMenu(table);
          EndPopup();
        }
        else {
          table->IsContextPopupOpen = false;
        }
      }
      uVar25 = table->Flags;
      if (((byte)((uVar25 & 8) >> 3) & table->IsSortSpecsDirty) == 1) {
        TableSortSpecsBuild(table);
        uVar25 = table->Flags;
      }
      pIVar2 = table->InnerWindow;
      if ((uVar25 >> 0x13 & 1) == 0) {
        ImDrawList::PushClipRect
                  (pIVar2->DrawList,(pIVar2->ClipRect).Min,(pIVar2->ClipRect).Max,false);
      }
      else {
        ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar2->DrawList,2);
      }
      return;
    }
LAB_0018da1a:
    pcVar10 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
  }
  else {
    fVar29 = (fVar29 + table->OuterPaddingX) - table->CellSpacingX1;
    uVar20 = 0;
    iVar11 = 0;
    while (pbVar6 = (byte *)((table->DisplayOrderToIndex).Data + uVar20),
          pbVar6 < (table->DisplayOrderToIndex).DataEnd) {
      bVar8 = *pbVar6;
      if (((long)(char)bVar8 < 0) ||
         (pIVar21 = (table->Columns).Data + (char)bVar8, (table->Columns).DataEnd <= pIVar21))
      goto LAB_0018da1a;
      bVar23 = true;
      if (table->FreezeRowsCount < '\x01') {
        bVar23 = (char)bVar8 < table->FreezeColumnsCount;
      }
      pIVar21->NavLayerCurrent = bVar23;
      if (bVar22) {
        bVar22 = true;
        if (iVar11 == table->FreezeColumnsCount) {
          fVar29 = fVar29 + (fVar28 - (table->OuterRect).Min.x);
          goto LAB_0018d53d;
        }
      }
      else {
LAB_0018d53d:
        bVar22 = false;
      }
      pbVar6 = (byte *)((long)&pIVar21->Flags + 2);
      *pbVar6 = *pbVar6 & 0xf;
      if ((table->EnabledMaskByDisplayOrder >> (uVar20 & 0x3f) & 1) == 0) {
        (pIVar21->ClipRect).Max.x = fVar29;
        (pIVar21->ClipRect).Min.x = fVar29;
        pIVar21->WorkMinX = fVar29;
        pIVar21->MaxX = fVar29;
        pIVar21->MinX = fVar29;
        pIVar21->WidthGiven = 0.0;
        (pIVar21->ClipRect).Min.y = fVar31;
        (pIVar21->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar21->ClipRect,&local_58);
        pIVar21->IsVisibleX = false;
        pIVar21->IsVisibleY = false;
        pIVar21->IsRequestOutput = false;
        pIVar21->IsSkipItems = true;
        pIVar21->ItemWidth = 1.0;
      }
      else {
        if (((bVar5) && (fVar26 = (local_48->IO).MousePos.x, (pIVar21->ClipRect).Min.x <= fVar26))
           && (fVar26 < (pIVar21->ClipRect).Max.x)) {
          table->HoveredColumnBody = bVar8;
        }
        pIVar21->MinX = fVar29;
        fVar27 = TableGetMaxColumnWidth(table,(int)(char)bVar8);
        fVar26 = pIVar21->WidthGiven;
        if (fVar27 <= pIVar21->WidthGiven) {
          fVar26 = fVar27;
        }
        fVar27 = pIVar21->WidthRequest;
        if (table->MinColumnWidth <= pIVar21->WidthRequest) {
          fVar27 = table->MinColumnWidth;
        }
        fVar32 = (float)(~-(uint)(fVar27 <= fVar26) & (uint)fVar27 |
                        (uint)fVar26 & -(uint)(fVar27 <= fVar26));
        pIVar21->WidthGiven = fVar32;
        fVar26 = table->CellPaddingX;
        fVar27 = table->CellSpacingX1;
        fVar30 = table->CellSpacingX2;
        fVar33 = fVar26 + fVar26 + fVar32 + fVar29 + fVar27 + fVar30;
        pIVar21->MaxX = fVar33;
        pIVar21->WorkMinX = fVar26 + pIVar21->MinX + fVar27;
        pIVar21->WorkMaxX = (fVar33 - fVar26) - fVar30;
        pIVar21->ItemWidth = (float)(int)(fVar32 * 0.65);
        (pIVar21->ClipRect).Min.x = pIVar21->MinX;
        (pIVar21->ClipRect).Min.y = fVar31;
        (pIVar21->ClipRect).Max.x = fVar33;
        (pIVar21->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar21->ClipRect,&local_58);
        fVar26 = (pIVar21->ClipRect).Min.x;
        fVar27 = (pIVar21->ClipRect).Max.x;
        pIVar21->IsVisibleX = fVar26 < fVar27;
        pIVar21->IsVisibleY = true;
        if (fVar27 <= fVar26) {
          if (pIVar21->AutoFitQueue != '\0') goto LAB_0018d70a;
          bVar23 = pIVar21->CannotSkipItemsQueue != '\0';
          pIVar21->IsRequestOutput = bVar23;
          if (bVar23) goto LAB_0018d715;
        }
        else {
          table->VisibleMaskByIndex = table->VisibleMaskByIndex | 1L << (bVar8 & 0x3f);
LAB_0018d70a:
          pIVar21->IsRequestOutput = true;
LAB_0018d715:
          table->RequestOutputMaskByIndex = table->RequestOutputMaskByIndex | 1L << (bVar8 & 0x3f);
        }
        bVar23 = true;
        if (pIVar21->IsEnabled == true) {
          bVar23 = table->HostSkipItems;
        }
        pIVar21->IsSkipItems = bVar23;
        if (bVar23 == true && fVar26 < fVar27) {
          __assert_fail("!is_visible",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                        ,0x3d5,"void ImGui::TableUpdateLayout(ImGuiTable *)");
        }
        uVar25 = (uint)(fVar26 < fVar27) << 0x15 | pIVar21->Flags;
        uVar18 = uVar25 | 0x100000;
        pIVar21->Flags = uVar18;
        if (pIVar21->SortOrder != -1) {
          uVar18 = uVar25 | 0x500000;
          pIVar21->Flags = uVar18;
        }
        if (table->HoveredColumnBody == bVar8) {
          pIVar21->Flags = uVar18 | 0x800000;
        }
        fVar26 = pIVar21->WorkMinX;
        pIVar21->ContentMaxXFrozen = fVar26;
        pIVar21->ContentMaxXUnfrozen = fVar26;
        pIVar21->ContentMaxXHeadersUsed = fVar26;
        pIVar21->ContentMaxXHeadersIdeal = fVar26;
        if (table->HostSkipItems == false) {
          pIVar21->AutoFitQueue = pIVar21->AutoFitQueue >> 1;
          pIVar21->CannotSkipItemsQueue = pIVar21->CannotSkipItemsQueue >> 1;
        }
        if (iVar11 < table->FreezeColumnsCount) {
          fVar27 = pIVar21->MaxX + 1.0;
          fVar26 = local_58.Max.x;
          if (fVar27 <= local_58.Max.x) {
            fVar26 = fVar27;
          }
          local_58.Min.x =
               (float)(-(uint)(fVar27 < local_58.Min.x) & (uint)local_58.Min.x |
                      ~-(uint)(fVar27 < local_58.Min.x) & (uint)fVar26);
        }
        fVar29 = fVar29 + table->CellPaddingX + table->CellPaddingX +
                          pIVar21->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2;
        iVar11 = iVar11 + 1;
      }
      uVar20 = uVar20 + 1;
      uVar17 = (ulong)table->ColumnsCount;
      if ((long)uVar17 <= (long)uVar20) goto LAB_0018d83a;
    }
LAB_0018da31:
    pcVar10 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
  }
  __assert_fail("p >= Data && p < DataEnd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_internal.h"
                ,0x20c,pcVar10);
}

Assistant:

void ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
    table->IsDefaultDisplayOrder = true;
    table->ColumnsEnabledCount = 0;
    table->EnabledMaskByIndex = 0x00;
    table->EnabledMaskByDisplayOrder = 0x00;
    table->MinColumnWidth = ImMax(1.0f, g.Style.FramePadding.x * 1.0f); // g.Style.ColumnsMinSpacing; // FIXME-TABLE

    // [Part 1] Apply/lock Enabled and Order states. Calculate auto/ideal width for columns. Count fixed/stretch columns.
    // Process columns in their visible orders as we are building the Prev/Next indices.
    int count_fixed = 0;                // Number of columns that have fixed sizing policies
    int count_stretch = 0;              // Number of columns that have stretch sizing policies
    int last_visible_column_idx = -1;
    bool has_auto_fit_request = false;
    bool has_resizable = false;
    float stretch_sum_width_auto = 0.0f;
    float fixed_max_width_auto = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        if (column_n != order_n)
            table->IsDefaultDisplayOrder = false;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Clear column setup if not submitted by user. Currently we make it mandatory to call TableSetupColumn() every frame.
        // It would easily work without but we're not ready to guarantee it since e.g. names need resubmission anyway.
        // We take a slight shortcut but in theory we could be calling TableSetupColumn() here with dummy values, it should yield the same effect.
        if (table->DeclColumnsCount <= column_n)
        {
            TableSetupColumnFlags(table, column, ImGuiTableColumnFlags_None);
            column->NameOffset = -1;
            column->UserID = 0;
            column->InitStretchWeightOrWidth = -1.0f;
        }

        // Update Enabled state, mark settings/sortspecs dirty
        if (!(table->Flags & ImGuiTableFlags_Hideable) || (column->Flags & ImGuiTableColumnFlags_NoHide))
            column->IsEnabledNextFrame = true;
        if (column->IsEnabled != column->IsEnabledNextFrame)
        {
            column->IsEnabled = column->IsEnabledNextFrame;
            table->IsSettingsDirty = true;
            if (!column->IsEnabled && column->SortOrder != -1)
                table->IsSortSpecsDirty = true;
        }
        if (column->SortOrder > 0 && !(table->Flags & ImGuiTableFlags_SortMulti))
            table->IsSortSpecsDirty = true;

        // Auto-fit unsized columns
        const bool start_auto_fit = (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? (column->WidthRequest < 0.0f) : (column->StretchWeight < 0.0f);
        if (start_auto_fit)
            column->AutoFitQueue = column->CannotSkipItemsQueue = (1 << 3) - 1; // Fit for three frames

        if (!column->IsEnabled)
        {
            column->IndexWithinEnabledSet = -1;
            continue;
        }

        // Mark as enabled and link to previous/next enabled column
        column->PrevEnabledColumn = (ImGuiTableColumnIdx)last_visible_column_idx;
        column->NextEnabledColumn = -1;
        if (last_visible_column_idx != -1)
            table->Columns[last_visible_column_idx].NextEnabledColumn = (ImGuiTableColumnIdx)column_n;
        column->IndexWithinEnabledSet = table->ColumnsEnabledCount++;
        table->EnabledMaskByIndex |= (ImU64)1 << column_n;
        table->EnabledMaskByDisplayOrder |= (ImU64)1 << column->DisplayOrder;
        last_visible_column_idx = column_n;
        IM_ASSERT(column->IndexWithinEnabledSet <= column->DisplayOrder);

        // Calculate ideal/auto column width (that's the width required for all contents to be visible without clipping)
        // Combine width from regular rows + width from headers unless requested not to.
        if (!column->IsPreserveWidthAuto)
            column->WidthAuto = TableGetColumnWidthAuto(table, column);

        // Non-resizable columns keep their requested width (apply user value regardless of IsPreserveWidthAuto)
        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column_is_resizable)
            has_resizable = true;
        if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f && !column_is_resizable)
            column->WidthAuto = column->InitStretchWeightOrWidth;

        if (column->AutoFitQueue != 0x00)
            has_auto_fit_request = true;
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            stretch_sum_width_auto += column->WidthAuto;
            count_stretch++;
        }
        else
        {
            fixed_max_width_auto = ImMax(fixed_max_width_auto, column->WidthAuto);
            count_fixed++;
        }
    }
    if ((table->Flags & ImGuiTableFlags_Sortable) && table->SortSpecsCount == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        table->IsSortSpecsDirty = true;
    table->RightMostEnabledColumn = (ImGuiTableColumnIdx)last_visible_column_idx;
    IM_ASSERT(table->RightMostEnabledColumn >= 0);

    // [Part 2] Disable child window clipping while fitting columns. This is not strictly necessary but makes it possible
    // to avoid the column fitting having to wait until the first visible frame of the child container (may or not be a good thing).
    // FIXME-TABLE: for always auto-resizing columns may not want to do that all the time.
    if (has_auto_fit_request && table->OuterWindow != table->InnerWindow)
        table->InnerWindow->SkipItems = false;
    if (has_auto_fit_request)
        table->IsSettingsDirty = true;

    // [Part 3] Fix column flags and record a few extra information.
    float sum_width_requests = 0.0f;        // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns but including spacing/padding.
    float stretch_sum_weights = 0.0f;       // Sum of all weights for stretch columns.
    table->LeftMostStretchedColumn = table->RightMostStretchedColumn = -1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const bool column_is_resizable = (column->Flags & ImGuiTableColumnFlags_NoResize) == 0;
        if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
        {
            // Apply same widths policy
            float width_auto = column->WidthAuto;
            if (table_sizing_policy == ImGuiTableFlags_SizingFixedSame && (column->AutoFitQueue != 0x00 || !column_is_resizable))
                width_auto = fixed_max_width_auto; 

            // Apply automatic width
            // Latch initial size for fixed columns and update it constantly for auto-resizing column (unless clipped!)
            if (column->AutoFitQueue != 0x00)
                column->WidthRequest = width_auto;
            else if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !column_is_resizable && (table->RequestOutputMaskByIndex & ((ImU64)1 << column_n)))
                column->WidthRequest = width_auto;

            // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
            // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
            // large height (= first frame scrollbar display very off + clipper would skip lots of items).
            // This is merely making the side-effect less extreme, but doesn't properly fixes it.
            // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
            // FIXME: This break IsPreserveWidthAuto from not flickering if the stored WidthAuto was smaller.
            if (column->AutoFitQueue > 0x01 && table->IsInitializing && !column->IsPreserveWidthAuto)
                column->WidthRequest = ImMax(column->WidthRequest, table->MinColumnWidth * 4.0f); // FIXME-TABLE: Another constant/scale?
            sum_width_requests += column->WidthRequest;
        }
        else
        {
            // Initialize stretch weight
            if (column->AutoFitQueue != 0x00 || column->StretchWeight < 0.0f || !column_is_resizable)
            {
                if (column->InitStretchWeightOrWidth > 0.0f)
                    column->StretchWeight = column->InitStretchWeightOrWidth;
                else if (table_sizing_policy == ImGuiTableFlags_SizingStretchProp)
                    column->StretchWeight = (column->WidthAuto / stretch_sum_width_auto) * count_stretch;
                else
                    column->StretchWeight = 1.0f;
            }

            stretch_sum_weights += column->StretchWeight;
            if (table->LeftMostStretchedColumn == -1 || table->Columns[table->LeftMostStretchedColumn].DisplayOrder > column->DisplayOrder)
                table->LeftMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
            if (table->RightMostStretchedColumn == -1 || table->Columns[table->RightMostStretchedColumn].DisplayOrder < column->DisplayOrder)
                table->RightMostStretchedColumn = (ImGuiTableColumnIdx)column_n;
        }
        column->IsPreserveWidthAuto = false;
        sum_width_requests += table->CellPaddingX * 2.0f;
    }
    table->ColumnsEnabledFixedCount = (ImGuiTableColumnIdx)count_fixed;

    // [Part 4] Apply final widths based on requested widths
    const ImRect work_rect = table->WorkRect;
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    const float width_avail = ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f) ? table->InnerClipRect.GetWidth() : work_rect.GetWidth();
    const float width_avail_for_stretched_columns = width_avail - width_spacings - sum_width_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;
    table->ColumnsGivenWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->EnabledMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Allocate width for stretched/weighted columns (StretchWeight gets converted into WidthRequest)
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            float weight_ratio = column->StretchWeight / stretch_sum_weights;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, table->MinColumnWidth) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // See additional comments in TableSetColumnWidth().
        if (column->NextEnabledColumn == -1 && table->LeftMostStretchedColumn != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, table->MinColumnWidth));
        table->ColumnsGivenWidth += column->WidthGiven;
    }

    // [Part 5] Redistribute stretch remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor).
    if (width_remaining_for_stretched_columns >= 1.0f && !(table->Flags & ImGuiTableFlags_PreciseWidths))
        for (int order_n = table->ColumnsCount - 1; stretch_sum_weights > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // [Part 6] Setup final position, offset, skip/clip states and clipping rectangles, detect hovered column
    // Process columns in their visible orders as we are comparing the visible order and adjusting host_clip_rect while looping.
    int visible_n = 0;
    bool offset_x_frozen = (table->FreezeColumnsCount > 0);
    float offset_x = ((table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x) + table->OuterPaddingX - table->CellSpacingX1;
    ImRect host_clip_rect = table->InnerClipRect;
    //host_clip_rect.Max.x += table->CellPaddingX + table->CellSpacingX2;
    table->VisibleMaskByIndex = 0x00;
    table->RequestOutputMaskByIndex = 0x00;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        column->NavLayerCurrent = (ImS8)((table->FreezeRowsCount > 0 || column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);

        if (offset_x_frozen && table->FreezeColumnsCount == visible_n)
        {
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;
            offset_x_frozen = false;
        }

        // Clear status flags
        column->Flags &= ~ImGuiTableColumnFlags_StatusMask_;

        if ((table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = column->WorkMinX = column->ClipRect.Min.x = column->ClipRect.Max.x = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsVisibleX = column->IsVisibleY = column->IsRequestOutput = false;
            column->IsSkipItems = true;
            column->ItemWidth = 1.0f;
            continue;
        }

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)column_n;

        // Lock start position
        column->MinX = offset_x;

        // Lock width based on start position and minimum/maximum width for this position
        float max_width = TableGetMaxColumnWidth(table, column_n);
        column->WidthGiven = ImMin(column->WidthGiven, max_width);
        column->WidthGiven = ImMax(column->WidthGiven, ImMin(column->WidthRequest, table->MinColumnWidth));
        column->MaxX = offset_x + column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;

        // Lock other positions
        // - ClipRect.Min.x: Because merging draw commands doesn't compare min boundaries, we make ClipRect.Min.x match left bounds to be consistent regardless of merging.
        // - ClipRect.Max.x: using WorkMaxX instead of MaxX (aka including padding) makes things more consistent when resizing down, tho slightly detrimental to visibility in very-small column.
        // - ClipRect.Max.x: using MaxX makes it easier for header to receive hover highlight with no discontinuity and display sorting arrow.
        // - FIXME-TABLE: We want equal width columns to have equal (ClipRect.Max.x - WorkMinX) width, which means ClipRect.max.x cannot stray off host_clip_rect.Max.x else right-most column may appear shorter.
        column->WorkMinX = column->MinX + table->CellPaddingX + table->CellSpacingX1;
        column->WorkMaxX = column->MaxX - table->CellPaddingX - table->CellSpacingX2; // Expected max
        column->ItemWidth = ImFloor(column->WidthGiven * 0.65f);
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX; //column->WorkMaxX;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        // Mark column as Clipped (not in sight)
        // Note that scrolling tables (where inner_window != outer_window) handle Y clipped earlier in BeginTable() so IsVisibleY really only applies to non-scrolling tables.
        // FIXME-TABLE: Because InnerClipRect.Max.y is conservatively ==outer_window->ClipRect.Max.y, we never can mark columns _Above_ the scroll line as not IsVisibleY.
        // Taking advantage of LastOuterHeight would yield good results there...
        // FIXME-TABLE: Y clipping is disabled because it effectively means not submitting will reduce contents width which is fed to outer_window->DC.CursorMaxPos.x,
        // and this may be used (e.g. typically by outer_window using AlwaysAutoResize or outer_window's horizontal scrollbar, but could be something else).
        // Possible solution to preserve last known content width for clipped column. Test 'table_reported_size' fails when enabling Y clipping and window is resized small.
        column->IsVisibleX = (column->ClipRect.Max.x > column->ClipRect.Min.x);
        column->IsVisibleY = true; // (column->ClipRect.Max.y > column->ClipRect.Min.y);
        const bool is_visible = column->IsVisibleX; //&& column->IsVisibleY;
        if (is_visible)
            table->VisibleMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as requesting output from user. Note that fixed + non-resizable sets are auto-fitting at all times and therefore always request output.
        column->IsRequestOutput = is_visible || column->AutoFitQueue != 0 || column->CannotSkipItemsQueue != 0;
        if (column->IsRequestOutput)
            table->RequestOutputMaskByIndex |= ((ImU64)1 << column_n);

        // Mark column as SkipItems (ignoring all items/layout)
        column->IsSkipItems = !column->IsEnabled || table->HostSkipItems;
        if (column->IsSkipItems)
            IM_ASSERT(!is_visible);

        // Update status flags
        column->Flags |= ImGuiTableColumnFlags_IsEnabled;
        if (is_visible)
            column->Flags |= ImGuiTableColumnFlags_IsVisible;
        if (column->SortOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_IsSorted;
        if (table->HoveredColumnBody == column_n)
            column->Flags |= ImGuiTableColumnFlags_IsHovered;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->WorkMinX = ImMax(column->WorkMinX, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->WorkMinX = ImLerp(column->WorkMinX, ImMax(column->StartX, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        column->ContentMaxXFrozen = column->ContentMaxXUnfrozen = column->WorkMinX;
        column->ContentMaxXHeadersUsed = column->ContentMaxXHeadersIdeal = column->WorkMinX;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImClamp(column->MaxX + TABLE_BORDER_SIZE, host_clip_rect.Min.x, host_clip_rect.Max.x);

        offset_x += column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        visible_n++;
    }

    // [Part 7] Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag, either
    // because of using _WidthAuto/_WidthStretch). This will hide the resizing option from the context menu.
    const float unused_x1 = ImMax(table->WorkRect.Min.x, table->Columns[table->RightMostEnabledColumn].ClipRect.Max.x);
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImGuiTableColumnIdx)table->ColumnsCount;
    }
    if (has_resizable == false && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // [Part 8] Lock actual OuterRect/WorkRect right-most position.
    // This is done late to handle the case of fixed-columns tables not claiming more widths that they need.
    // Because of this we are careful with uses of WorkRect and InnerClipRect before this point.
    if (table->RightMostStretchedColumn != -1)
        table->IsOuterRectMinFitX = false;
    if (table->IsOuterRectMinFitX)
    {
        table->OuterRect.Max.x = table->WorkRect.Max.x = unused_x1;
        table->InnerClipRect.Max.x = ImMin(table->InnerClipRect.Max.x, unused_x1);
    }
    table->InnerWindow->ParentWorkRect = table->WorkRect;
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // [Part 9] Allocate draw channels and setup background cliprect
    TableSetupDrawChannels(table);

    // [Part 10] Hit testing on borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // [Part 11] Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // [Part 13] Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClip)
        table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_NOCLIP);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);
}